

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall capnp::Capability::Client::whenResolved(Client *this)

{
  long in_RSI;
  undefined1 auStack_28 [24];
  
  ClientHook::whenResolved((ClientHook *)auStack_28);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(auStack_28 + 8);
  kj::Promise<void>::attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<capnp::ClientHook,_std::nullptr_t> *)auStack_28);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(auStack_28 + 8));
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)auStack_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Capability::Client::whenResolved() {
  return hook->whenResolved().attach(hook->addRef());
}